

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprSwitch * AnalyzeSwitch(ExpressionContext *ctx,SynSwitch *syntax)

{
  bool bVar1;
  int iVar2;
  ExprBase *expr;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  ExprBase *pEVar5;
  undefined4 extraout_var;
  _func_int **pp_Var6;
  SynBase *source;
  ExprBase *rhs;
  undefined4 extraout_var_01;
  ExprSwitch *pEVar7;
  SynSwitchCase *source_00;
  IntrusiveList<SynBase> *pIVar8;
  VariableData *local_78;
  ExprBase *local_70;
  IntrusiveList<ExprBase> expressions;
  IntrusiveList<ExprBase> blocks;
  IntrusiveList<ExprBase> cases;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  
  ExpressionContext::PushLoopScope(ctx,true,false);
  expr = AnalyzeExpression(ctx,syntax->condition);
  pTVar4 = expr->type;
  if (pTVar4 == ctx->typeVoid) {
    anon_unknown.dwarf_b837c::Report
              (ctx,syntax->condition,"ERROR: condition type cannot be \'%.*s\'");
    pTVar4 = expr->type;
  }
  if ((pTVar4 == (TypeBase *)0x0) || (pTVar4->typeID != 0)) {
    bVar1 = AssertValueExpression(ctx,syntax->condition,expr);
    pSVar3 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
    if (bVar1) {
      pTVar4 = expr->type;
    }
    else {
      pTVar4 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    }
    local_78 = anon_unknown.dwarf_b837c::AllocateTemporary(ctx,pSVar3,pTVar4);
    pSVar3 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
    pEVar5 = CreateVariableAccess(ctx,pSVar3,local_78,false);
    pEVar5 = CreateAssignment(ctx,syntax->condition,pEVar5,expr);
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    expr = (ExprBase *)CONCAT44(extraout_var,iVar2);
    pSVar3 = syntax->condition;
    pTVar4 = ctx->typeVoid;
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
    pp_Var6 = (_func_int **)CONCAT44(extraout_var_00,iVar2);
    *pp_Var6 = (_func_int *)0x0;
    pp_Var6[1] = (_func_int *)local_78;
    pp_Var6[2] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var6 + 3) = 0;
    expr->typeID = 0x1e;
    expr->source = pSVar3;
    expr->type = pTVar4;
    expr->next = (ExprBase *)0x0;
    expr->listed = false;
    expr->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240a48;
    expr[1]._vptr_ExprBase = pp_Var6;
    *(ExprBase **)&expr[1].typeID = pEVar5;
  }
  else {
    local_78 = (VariableData *)0x0;
  }
  cases.head = (ExprBase *)0x0;
  cases.tail = (ExprBase *)0x0;
  blocks.head = (ExprBase *)0x0;
  blocks.tail = (ExprBase *)0x0;
  source_00 = (syntax->cases).head;
  local_70 = (ExprBase *)0x0;
  while (source_00 != (SynSwitchCase *)0x0) {
    if (source_00->value != (SynBase *)0x0) {
      pEVar5 = AnalyzeExpression(ctx,source_00->value);
      pTVar4 = pEVar5->type;
      if (((pTVar4 == (TypeBase *)0x0) || (pTVar4->typeID != 0)) &&
         ((expr->type == (TypeBase *)0x0 || (expr->type->typeID != 0)))) {
        if (pTVar4 == ctx->typeVoid) {
          anon_unknown.dwarf_b837c::Report
                    (ctx,syntax->condition,"ERROR: case value type cannot be \'%.*s\'");
        }
        pSVar3 = source_00->value;
        source = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
        rhs = CreateVariableAccess(ctx,source,local_78,false);
        pEVar5 = CreateBinaryOp(ctx,pSVar3,SYN_BINARY_OP_EQUAL,pEVar5,rhs);
        pTVar4 = pEVar5->type;
        bVar1 = ExpressionContext::IsIntegerType(ctx,pTVar4);
        if ((!bVar1) || (pTVar4 == ctx->typeLong)) {
          anon_unknown.dwarf_b837c::Report
                    (ctx,&source_00->super_SynBase,
                     "ERROR: \'==\' operator result type must be bool, char, short or int");
        }
      }
      IntrusiveList<ExprBase>::push_back(&cases,pEVar5);
    }
    expressions.head = (ExprBase *)0x0;
    expressions.tail = (ExprBase *)0x0;
    pIVar8 = &source_00->expressions;
    while (pSVar3 = pIVar8->head, pSVar3 != (SynBase *)0x0) {
      pEVar5 = AnalyzeStatement(ctx,pSVar3);
      IntrusiveList<ExprBase>::push_back(&expressions,pEVar5);
      pIVar8 = (IntrusiveList<SynBase> *)&pSVar3->next;
    }
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar5 = (ExprBase *)CONCAT44(extraout_var_01,iVar2);
    pSVar3 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
    pTVar4 = ctx->typeVoid;
    pEVar5->typeID = 0x36;
    pEVar5->source = pSVar3;
    pEVar5->type = pTVar4;
    pEVar5->next = (ExprBase *)0x0;
    pEVar5->listed = false;
    pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002410a0;
    pEVar5[1]._vptr_ExprBase = (_func_int **)expressions.head;
    *(ExprBase **)&pEVar5[1].typeID = expressions.tail;
    pEVar5[1].source = (SynBase *)0x0;
    if (source_00->value != (SynBase *)0x0) {
      IntrusiveList<ExprBase>::push_back(&blocks,pEVar5);
      pEVar5 = local_70;
    }
    local_70 = pEVar5;
    source_00 = (SynSwitchCase *)(source_00->super_SynBase).next;
    if ((source_00 == (SynSwitchCase *)0x0) || ((source_00->super_SynBase).typeID != 0x2d)) {
      source_00 = (SynSwitchCase *)0x0;
    }
  }
  ExpressionContext::PopScope(ctx,SCOPE_LOOP);
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
  pEVar7 = (ExprSwitch *)CONCAT44(extraout_var_02,iVar2);
  pTVar4 = ctx->typeVoid;
  (pEVar7->super_ExprBase).typeID = 0x33;
  (pEVar7->super_ExprBase).source = &syntax->super_SynBase;
  (pEVar7->super_ExprBase).type = pTVar4;
  (pEVar7->super_ExprBase).next = (ExprBase *)0x0;
  (pEVar7->super_ExprBase).listed = false;
  (pEVar7->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00241378;
  pEVar7->condition = expr;
  (pEVar7->cases).head = cases.head;
  (pEVar7->cases).tail = cases.tail;
  (pEVar7->blocks).head = blocks.head;
  (pEVar7->blocks).tail = blocks.tail;
  pEVar7->defaultBlock = local_70;
  return pEVar7;
}

Assistant:

ExprSwitch* AnalyzeSwitch(ExpressionContext &ctx, SynSwitch *syntax)
{
	ctx.PushLoopScope(true, false);

	ExprBase *condition = AnalyzeExpression(ctx, syntax->condition);

	if(condition->type == ctx.typeVoid)
		Report(ctx, syntax->condition, "ERROR: condition type cannot be '%.*s'", FMT_ISTR(condition->type->name));

	VariableData *conditionVariable = NULL;
	
	if(!isType<TypeError>(condition->type))
	{
		if(!AssertValueExpression(ctx, syntax->condition, condition))
			conditionVariable = AllocateTemporary(ctx, ctx.MakeInternal(syntax), ctx.GetErrorType());
		else
			conditionVariable = AllocateTemporary(ctx, ctx.MakeInternal(syntax), condition->type);

		ExprBase *access = CreateVariableAccess(ctx, ctx.MakeInternal(syntax), conditionVariable, false);

		ExprBase *initializer = CreateAssignment(ctx, syntax->condition, access, condition);

		condition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntax->condition, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, conditionVariable), initializer);
	}

	IntrusiveList<ExprBase> cases;
	IntrusiveList<ExprBase> blocks;
	ExprBase *defaultBlock = NULL;

	for(SynSwitchCase *curr = syntax->cases.head; curr; curr = getType<SynSwitchCase>(curr->next))
	{
		if(curr->value)
		{
			ExprBase *caseValue = AnalyzeExpression(ctx, curr->value);

			if(isType<TypeError>(caseValue->type) || isType<TypeError>(condition->type))
			{
				cases.push_back(caseValue);
			}
			else
			{
				if(caseValue->type == ctx.typeVoid)
					Report(ctx, syntax->condition, "ERROR: case value type cannot be '%.*s'", FMT_ISTR(caseValue->type->name));

				ExprBase *conditionValue = CreateBinaryOp(ctx, curr->value, SYN_BINARY_OP_EQUAL, caseValue, CreateVariableAccess(ctx, ctx.MakeInternal(syntax), conditionVariable, false));

				if(!ctx.IsIntegerType(conditionValue->type) || conditionValue->type == ctx.typeLong)
					Report(ctx, curr, "ERROR: '==' operator result type must be bool, char, short or int");

				cases.push_back(conditionValue);
			}
		}

		IntrusiveList<ExprBase> expressions;

		for(SynBase *expression = curr->expressions.head; expression; expression = expression->next)
			expressions.push_back(AnalyzeStatement(ctx, expression));

		ExprBase *block = new (ctx.get<ExprBlock>()) ExprBlock(ctx.MakeInternal(syntax), ctx.typeVoid, expressions, NULL);

		if(curr->value)
			blocks.push_back(block);
		else
			defaultBlock = block;
	}

	ctx.PopScope(SCOPE_LOOP);

	return new (ctx.get<ExprSwitch>()) ExprSwitch(syntax, ctx.typeVoid, condition, cases, blocks, defaultBlock);
}